

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O0

void * __thiscall
kj::Arena::allocateBytes(Arena *this,size_t amount,uint alignment,bool hasDisposer)

{
  bool bVar1;
  WiderType<Decay<unsigned_int_&>,_Decay<unsigned_long>_> WVar2;
  size_t sVar3;
  Fault local_78;
  Fault f;
  ulong local_68;
  DebugExpression<unsigned_long> local_60;
  undefined1 local_58 [8];
  DebugComparison<unsigned_long,_int> _kjCondition;
  void *result;
  byte local_1d;
  uint local_1c;
  bool hasDisposer_local;
  size_t sStack_18;
  uint alignment_local;
  size_t amount_local;
  Arena *this_local;
  
  local_1d = hasDisposer;
  local_1c = alignment;
  sStack_18 = amount;
  amount_local = (size_t)this;
  if (hasDisposer) {
    result = (void *)0x8;
    WVar2 = max<unsigned_int&,unsigned_long>(&local_1c,(unsigned_long *)&result);
    local_1c = (uint)WVar2;
    sVar3 = anon_unknown_53::alignTo(0x10,local_1c);
    sStack_18 = sVar3 + sStack_18;
  }
  _kjCondition._32_8_ = allocateBytesInternal(this,sStack_18,local_1c);
  if ((local_1d & 1) != 0) {
    _kjCondition._32_8_ = anon_unknown_53::alignTo((byte *)(_kjCondition._32_8_ + 0x10),local_1c);
  }
  local_68 = (ulong)_kjCondition._32_8_ % (ulong)local_1c;
  local_60 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_68);
  f.exception._4_4_ = 0;
  kj::_::DebugExpression<unsigned_long>::operator==
            ((DebugComparison<unsigned_long,_int> *)local_58,&local_60,
             (int *)((long)&f.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_58);
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&>
              (&local_78,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/arena.c++"
               ,0x69,FAILED,"reinterpret_cast<uintptr_t>(result) % alignment == 0","_kjCondition,",
               (DebugComparison<unsigned_long,_int> *)local_58);
    kj::_::Debug::Fault::fatal(&local_78);
  }
  return (void *)_kjCondition._32_8_;
}

Assistant:

void* Arena::allocateBytes(size_t amount, uint alignment, bool hasDisposer) {
  if (hasDisposer) {
    alignment = kj::max(alignment, alignof(ObjectHeader));
    amount += alignTo(sizeof(ObjectHeader), alignment);
  }

  void* result = allocateBytesInternal(amount, alignment);

  if (hasDisposer) {
    // Reserve space for the ObjectHeader, but don't add it to the object list yet.
    result = alignTo(reinterpret_cast<byte*>(result) + sizeof(ObjectHeader), alignment);
  }

  KJ_DASSERT(reinterpret_cast<uintptr_t>(result) % alignment == 0);
  return result;
}